

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmExecuteProcessCommand.cxx
# Opt level: O1

bool __thiscall
cmExecuteProcessCommand::InitialPass
          (cmExecuteProcessCommand *this,
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          *args,cmExecutionStatus *param_2)

{
  vector<char_const*,std::allocator<char_const*>> *this_00;
  iterator __position;
  bool bVar1;
  int iVar2;
  uint uVar3;
  undefined8 uVar4;
  cmsysProcess *cp;
  long *plVar5;
  char *pcVar6;
  ostream *poVar7;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar8;
  bool bVar9;
  ulong unaff_RBP;
  ulong uVar10;
  pointer pbVar11;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *pbVar12;
  long lVar13;
  cmMakefile *this_01;
  ulong uVar14;
  vector<std::vector<const_char_*,_std::allocator<const_char_*>_>,_std::allocator<std::vector<const_char_*,_std::allocator<const_char_*>_>_>_>
  cmds;
  int length;
  vector<char,_std::allocator<char>_> tempOutput;
  string timeout_string;
  string arguments;
  string output_file;
  string error_variable;
  string output_variable;
  vector<char,_std::allocator<char>_> tempError;
  char *data;
  double timeout;
  string result_variable;
  string error_file;
  string working_directory;
  string input_file;
  ostringstream e;
  vector<std::vector<const_char_*,_std::allocator<const_char_*>_>,_std::allocator<std::vector<const_char_*,_std::allocator<const_char_*>_>_>_>
  local_358;
  int local_33c;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_338;
  ulong local_318;
  undefined1 *local_310;
  long local_308;
  undefined1 local_300;
  undefined7 uStack_2ff;
  undefined1 *local_2f0;
  undefined8 local_2e8;
  undefined1 local_2e0;
  undefined7 uStack_2df;
  undefined8 local_2d0;
  undefined8 local_2c8;
  uint local_2bc;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_2b8;
  string local_298;
  string local_278;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_258;
  char *local_238;
  double local_230;
  string local_228;
  char *local_208;
  size_t local_200;
  char local_1f8;
  undefined7 uStack_1f7;
  char *local_1e8;
  long local_1e0;
  char local_1d8;
  undefined7 uStack_1d7;
  char *local_1c8;
  long local_1c0;
  char local_1b8;
  undefined7 uStack_1b7;
  undefined1 local_1a8 [8];
  pointer ppcStack_1a0;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_198 [6];
  ios_base local_138 [264];
  
  if ((args->
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      )._M_impl.super__Vector_impl_data._M_finish ==
      (args->
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      )._M_impl.super__Vector_impl_data._M_start) {
    local_1a8 = (undefined1  [8])local_198;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)local_1a8,"called with incorrect number of arguments","");
    cmCommand::SetError(&this->super_cmCommand,(string *)local_1a8);
    if (local_1a8 != (undefined1  [8])local_198) {
      operator_delete((void *)local_1a8,local_198[0]._M_allocated_capacity + 1);
    }
    return false;
  }
  local_358.
  super__Vector_base<std::vector<const_char_*,_std::allocator<const_char_*>_>,_std::allocator<std::vector<const_char_*,_std::allocator<const_char_*>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_358.
  super__Vector_base<std::vector<const_char_*,_std::allocator<const_char_*>_>,_std::allocator<std::vector<const_char_*,_std::allocator<const_char_*>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  bVar9 = false;
  local_358.
  super__Vector_base<std::vector<const_char_*,_std::allocator<const_char_*>_>,_std::allocator<std::vector<const_char_*,_std::allocator<const_char_*>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_2f0 = &local_2e0;
  local_2e8 = 0;
  local_2e0 = 0;
  local_310 = &local_300;
  local_308 = 0;
  local_300 = 0;
  local_1c8 = &local_1b8;
  local_1c0 = 0;
  local_1b8 = '\0';
  local_2b8._M_dataplus._M_p = (pointer)&local_2b8.field_2;
  local_2b8._M_string_length = 0;
  local_2b8.field_2._M_local_buf[0] = '\0';
  local_208 = &local_1f8;
  local_200 = 0;
  local_1f8 = '\0';
  local_278._M_dataplus._M_p = (pointer)&local_278.field_2;
  local_278._M_string_length = 0;
  local_278.field_2._M_local_buf[0] = '\0';
  local_298._M_dataplus._M_p = (pointer)&local_298.field_2;
  local_298._M_string_length = 0;
  local_298.field_2._M_local_buf[0] = '\0';
  local_228._M_dataplus._M_p = (pointer)&local_228.field_2;
  local_228._M_string_length = 0;
  local_228.field_2._M_local_buf[0] = '\0';
  local_1e8 = &local_1d8;
  local_1e0 = 0;
  local_1d8 = '\0';
  pbVar11 = (args->
            super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            )._M_impl.super__Vector_impl_data._M_start;
  local_318 = 0;
  local_2c8 = 0;
  local_2d0 = 0;
  if ((args->
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      )._M_impl.super__Vector_impl_data._M_finish != pbVar11) {
    uVar14 = 0;
    local_2d0 = 0;
    local_2c8 = 0;
    local_318 = 0;
    bVar9 = false;
    lVar13 = 0;
    unaff_RBP = 0;
    do {
      iVar2 = std::__cxx11::string::compare((char *)(pbVar11 + uVar14));
      if (iVar2 == 0) {
        lVar13 = (long)local_358.
                       super__Vector_base<std::vector<const_char_*,_std::allocator<const_char_*>_>,_std::allocator<std::vector<const_char_*,_std::allocator<const_char_*>_>_>_>
                       ._M_impl.super__Vector_impl_data._M_finish -
                 (long)local_358.
                       super__Vector_base<std::vector<const_char_*,_std::allocator<const_char_*>_>,_std::allocator<std::vector<const_char_*,_std::allocator<const_char_*>_>_>_>
                       ._M_impl.super__Vector_impl_data._M_start;
        local_1a8 = (undefined1  [8])0x0;
        ppcStack_1a0 = (pointer)0x0;
        local_198[0]._M_allocated_capacity = (pointer)0x0;
        std::
        vector<std::vector<char_const*,std::allocator<char_const*>>,std::allocator<std::vector<char_const*,std::allocator<char_const*>>>>
        ::emplace_back<std::vector<char_const*,std::allocator<char_const*>>>
                  ((vector<std::vector<char_const*,std::allocator<char_const*>>,std::allocator<std::vector<char_const*,std::allocator<char_const*>>>>
                    *)&local_358,(vector<const_char_*,_std::allocator<const_char_*>_> *)local_1a8);
        if (local_1a8 != (undefined1  [8])0x0) {
          operator_delete((void *)local_1a8,local_198[0]._M_allocated_capacity - (long)local_1a8);
        }
        lVar13 = (lVar13 >> 3) * -0x5555555555555555;
        unaff_RBP = 1;
      }
      else {
        iVar2 = std::__cxx11::string::compare
                          ((char *)((args->
                                    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                    )._M_impl.super__Vector_impl_data._M_start + uVar14));
        if (iVar2 == 0) {
          uVar14 = uVar14 + 1;
          if ((ulong)((long)(args->
                            super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                            )._M_impl.super__Vector_impl_data._M_finish -
                      (long)(args->
                            super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                            )._M_impl.super__Vector_impl_data._M_start >> 5) <= uVar14) {
            local_1a8 = (undefined1  [8])local_198;
            std::__cxx11::string::_M_construct<char_const*>
                      ((string *)local_1a8," called with no value for OUTPUT_VARIABLE.","");
            cmCommand::SetError(&this->super_cmCommand,(string *)local_1a8);
            goto LAB_002f0378;
          }
          std::__cxx11::string::_M_assign((string *)&local_278);
        }
        else {
          iVar2 = std::__cxx11::string::compare
                            ((char *)((args->
                                      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                      )._M_impl.super__Vector_impl_data._M_start + uVar14));
          if (iVar2 == 0) {
            uVar14 = uVar14 + 1;
            if ((ulong)((long)(args->
                              super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                              )._M_impl.super__Vector_impl_data._M_finish -
                        (long)(args->
                              super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                              )._M_impl.super__Vector_impl_data._M_start >> 5) <= uVar14) {
              local_1a8 = (undefined1  [8])local_198;
              std::__cxx11::string::_M_construct<char_const*>
                        ((string *)local_1a8," called with no value for ERROR_VARIABLE.","");
              cmCommand::SetError(&this->super_cmCommand,(string *)local_1a8);
              goto LAB_002f0378;
            }
            std::__cxx11::string::_M_assign((string *)&local_298);
          }
          else {
            iVar2 = std::__cxx11::string::compare
                              ((char *)((args->
                                        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                        )._M_impl.super__Vector_impl_data._M_start + uVar14));
            if (iVar2 == 0) {
              uVar14 = uVar14 + 1;
              if ((ulong)((long)(args->
                                super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                )._M_impl.super__Vector_impl_data._M_finish -
                          (long)(args->
                                super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                )._M_impl.super__Vector_impl_data._M_start >> 5) <= uVar14) {
                local_1a8 = (undefined1  [8])local_198;
                std::__cxx11::string::_M_construct<char_const*>
                          ((string *)local_1a8," called with no value for RESULT_VARIABLE.","");
                cmCommand::SetError(&this->super_cmCommand,(string *)local_1a8);
                goto LAB_002f0378;
              }
              std::__cxx11::string::_M_assign((string *)&local_228);
            }
            else {
              iVar2 = std::__cxx11::string::compare
                                ((char *)((args->
                                          super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                          )._M_impl.super__Vector_impl_data._M_start + uVar14));
              if (iVar2 == 0) {
                uVar14 = uVar14 + 1;
                if ((ulong)((long)(args->
                                  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                  )._M_impl.super__Vector_impl_data._M_finish -
                            (long)(args->
                                  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                  )._M_impl.super__Vector_impl_data._M_start >> 5) <= uVar14) {
                  local_1a8 = (undefined1  [8])local_198;
                  std::__cxx11::string::_M_construct<char_const*>
                            ((string *)local_1a8," called with no value for WORKING_DIRECTORY.","");
                  cmCommand::SetError(&this->super_cmCommand,(string *)local_1a8);
                  goto LAB_002f0378;
                }
                std::__cxx11::string::_M_assign((string *)&local_1e8);
              }
              else {
                iVar2 = std::__cxx11::string::compare
                                  ((char *)((args->
                                            super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                            )._M_impl.super__Vector_impl_data._M_start + uVar14));
                if (iVar2 == 0) {
                  uVar14 = uVar14 + 1;
                  if ((ulong)((long)(args->
                                    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                    )._M_impl.super__Vector_impl_data._M_finish -
                              (long)(args->
                                    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                    )._M_impl.super__Vector_impl_data._M_start >> 5) <= uVar14) {
                    local_1a8 = (undefined1  [8])local_198;
                    std::__cxx11::string::_M_construct<char_const*>
                              ((string *)local_1a8," called with no value for INPUT_FILE.","");
                    cmCommand::SetError(&this->super_cmCommand,(string *)local_1a8);
                    goto LAB_002f0378;
                  }
                  std::__cxx11::string::_M_assign((string *)&local_1c8);
                }
                else {
                  iVar2 = std::__cxx11::string::compare
                                    ((char *)((args->
                                              super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                              )._M_impl.super__Vector_impl_data._M_start + uVar14));
                  if (iVar2 == 0) {
                    uVar14 = uVar14 + 1;
                    if ((ulong)((long)(args->
                                      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                      )._M_impl.super__Vector_impl_data._M_finish -
                                (long)(args->
                                      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                      )._M_impl.super__Vector_impl_data._M_start >> 5) <= uVar14) {
                      local_1a8 = (undefined1  [8])local_198;
                      std::__cxx11::string::_M_construct<char_const*>
                                ((string *)local_1a8," called with no value for OUTPUT_FILE.","");
                      cmCommand::SetError(&this->super_cmCommand,(string *)local_1a8);
                      goto LAB_002f0378;
                    }
                    std::__cxx11::string::_M_assign((string *)&local_2b8);
                  }
                  else {
                    iVar2 = std::__cxx11::string::compare
                                      ((char *)((args->
                                                super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                                )._M_impl.super__Vector_impl_data._M_start + uVar14)
                                      );
                    if (iVar2 == 0) {
                      uVar14 = uVar14 + 1;
                      if ((ulong)((long)(args->
                                        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                        )._M_impl.super__Vector_impl_data._M_finish -
                                  (long)(args->
                                        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                        )._M_impl.super__Vector_impl_data._M_start >> 5) <= uVar14)
                      {
                        local_1a8 = (undefined1  [8])local_198;
                        std::__cxx11::string::_M_construct<char_const*>
                                  ((string *)local_1a8," called with no value for ERROR_FILE.","");
                        cmCommand::SetError(&this->super_cmCommand,(string *)local_1a8);
                        goto LAB_002f0378;
                      }
                      std::__cxx11::string::_M_assign((string *)&local_208);
                    }
                    else {
                      iVar2 = std::__cxx11::string::compare
                                        ((char *)((args->
                                                  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                                  )._M_impl.super__Vector_impl_data._M_start +
                                                 uVar14));
                      if (iVar2 == 0) {
                        uVar14 = uVar14 + 1;
                        if ((ulong)((long)(args->
                                          super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                          )._M_impl.super__Vector_impl_data._M_finish -
                                    (long)(args->
                                          super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                          )._M_impl.super__Vector_impl_data._M_start >> 5) <= uVar14
                           ) {
                          local_1a8 = (undefined1  [8])local_198;
                          std::__cxx11::string::_M_construct<char_const*>
                                    ((string *)local_1a8," called with no value for TIMEOUT.","");
                          cmCommand::SetError(&this->super_cmCommand,(string *)local_1a8);
                          goto LAB_002f0378;
                        }
                        std::__cxx11::string::_M_assign((string *)&local_310);
                      }
                      else {
                        iVar2 = std::__cxx11::string::compare
                                          ((char *)((args->
                                                  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                                  )._M_impl.super__Vector_impl_data._M_start +
                                                  uVar14));
                        if (iVar2 == 0) {
                          bVar9 = true;
                        }
                        else {
                          uVar4 = std::__cxx11::string::compare
                                            ((char *)((args->
                                                  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                                  )._M_impl.super__Vector_impl_data._M_start +
                                                  uVar14));
                          if ((int)uVar4 == 0) {
                            local_318 = CONCAT71((int7)((ulong)uVar4 >> 8),1);
                          }
                          else {
                            uVar4 = std::__cxx11::string::compare
                                              ((char *)((args->
                                                  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                                  )._M_impl.super__Vector_impl_data._M_start +
                                                  uVar14));
                            if ((int)uVar4 == 0) {
                              local_2c8 = CONCAT71((int7)((ulong)uVar4 >> 8),1);
                            }
                            else {
                              uVar4 = std::__cxx11::string::compare
                                                ((char *)((args->
                                                  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                                  )._M_impl.super__Vector_impl_data._M_start +
                                                  uVar14));
                              if ((int)uVar4 != 0) {
                                if (unaff_RBP != 0) {
                                  local_1a8 = (undefined1  [8])
                                              (args->
                                              super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                              )._M_impl.super__Vector_impl_data._M_start[uVar14].
                                              _M_dataplus._M_p;
                                  std::vector<const_char_*,_std::allocator<const_char_*>_>::
                                  push_back(local_358.
                                            super__Vector_base<std::vector<const_char_*,_std::allocator<const_char_*>_>,_std::allocator<std::vector<const_char_*,_std::allocator<const_char_*>_>_>_>
                                            ._M_impl.super__Vector_impl_data._M_start + lVar13,
                                            (value_type *)local_1a8);
                                  goto LAB_002efea9;
                                }
                                std::__cxx11::ostringstream::ostringstream
                                          ((ostringstream *)local_1a8);
                                std::__ostream_insert<char,std::char_traits<char>>
                                          ((ostream *)local_1a8," given unknown argument \"",0x19);
                                pbVar11 = (args->
                                          super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                          )._M_impl.super__Vector_impl_data._M_start;
                                poVar7 = std::__ostream_insert<char,std::char_traits<char>>
                                                   ((ostream *)local_1a8,
                                                    pbVar11[uVar14]._M_dataplus._M_p,
                                                    pbVar11[uVar14]._M_string_length);
                                std::__ostream_insert<char,std::char_traits<char>>(poVar7,"\".",2);
                                std::__cxx11::stringbuf::str();
                                cmCommand::SetError(&this->super_cmCommand,&local_338);
                                if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                                     *)local_338._M_dataplus._M_p != &local_338.field_2) {
                                  operator_delete(local_338._M_dataplus._M_p,
                                                  local_338.field_2._M_allocated_capacity + 1);
                                }
                                std::__cxx11::ostringstream::~ostringstream
                                          ((ostringstream *)local_1a8);
                                std::ios_base::~ios_base(local_138);
                                goto LAB_002f0395;
                              }
                              local_2d0 = CONCAT71((int7)((ulong)uVar4 >> 8),1);
                            }
                          }
                        }
                      }
                    }
                  }
                }
              }
            }
          }
        }
        unaff_RBP = 0;
      }
LAB_002efea9:
      uVar14 = uVar14 + 1;
      pbVar11 = (args->
                super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                )._M_impl.super__Vector_impl_data._M_start;
    } while (uVar14 < (ulong)((long)(args->
                                    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                    )._M_impl.super__Vector_impl_data._M_finish - (long)pbVar11 >> 5
                             ));
  }
  bVar1 = cmMakefile::CanIWriteThisFile((this->super_cmCommand).Makefile,local_2b8._M_dataplus._M_p)
  ;
  if (!bVar1) {
    std::operator+(&local_338,"attempted to output into a file: ",&local_2b8);
    plVar5 = (long *)std::__cxx11::string::append((char *)&local_338);
    local_1a8 = (undefined1  [8])local_198;
    paVar8 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
              *)(plVar5 + 2);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)*plVar5 == paVar8) {
      local_198[0]._0_8_ = paVar8->_M_allocated_capacity;
      local_198[0]._8_8_ = plVar5[3];
    }
    else {
      local_198[0]._0_8_ = paVar8->_M_allocated_capacity;
      local_1a8 = (undefined1  [8])*plVar5;
    }
    ppcStack_1a0 = (pointer)plVar5[1];
    *plVar5 = (long)paVar8;
    plVar5[1] = 0;
    *(undefined1 *)(plVar5 + 2) = 0;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_338._M_dataplus._M_p != &local_338.field_2) {
      operator_delete(local_338._M_dataplus._M_p,local_338.field_2._M_allocated_capacity + 1);
    }
    cmCommand::SetError(&this->super_cmCommand,(string *)local_1a8);
    cmSystemTools::s_FatalErrorOccured = true;
LAB_002f0378:
    if (local_1a8 != (undefined1  [8])local_198) {
      operator_delete((void *)local_1a8,local_198[0]._M_allocated_capacity + 1);
    }
LAB_002f0395:
    bVar9 = false;
    goto LAB_002f0397;
  }
  if (local_358.
      super__Vector_base<std::vector<const_char_*,_std::allocator<const_char_*>_>,_std::allocator<std::vector<const_char_*,_std::allocator<const_char_*>_>_>_>
      ._M_impl.super__Vector_impl_data._M_start ==
      local_358.
      super__Vector_base<std::vector<const_char_*,_std::allocator<const_char_*>_>,_std::allocator<std::vector<const_char_*,_std::allocator<const_char_*>_>_>_>
      ._M_impl.super__Vector_impl_data._M_finish) {
    local_1a8 = (undefined1  [8])local_198;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)local_1a8," called with no COMMAND argument.","");
    cmCommand::SetError(&this->super_cmCommand,(string *)local_1a8);
    goto LAB_002f0378;
  }
  if (local_358.
      super__Vector_base<std::vector<const_char_*,_std::allocator<const_char_*>_>,_std::allocator<std::vector<const_char_*,_std::allocator<const_char_*>_>_>_>
      ._M_impl.super__Vector_impl_data._M_finish !=
      local_358.
      super__Vector_base<std::vector<const_char_*,_std::allocator<const_char_*>_>,_std::allocator<std::vector<const_char_*,_std::allocator<const_char_*>_>_>_>
      ._M_impl.super__Vector_impl_data._M_start) {
    uVar14 = 0;
    uVar10 = 1;
    do {
      if (local_358.
          super__Vector_base<std::vector<const_char_*,_std::allocator<const_char_*>_>,_std::allocator<std::vector<const_char_*,_std::allocator<const_char_*>_>_>_>
          ._M_impl.super__Vector_impl_data._M_start[uVar14].
          super__Vector_base<const_char_*,_std::allocator<const_char_*>_>._M_impl.
          super__Vector_impl_data._M_start ==
          local_358.
          super__Vector_base<std::vector<const_char_*,_std::allocator<const_char_*>_>,_std::allocator<std::vector<const_char_*,_std::allocator<const_char_*>_>_>_>
          ._M_impl.super__Vector_impl_data._M_start[uVar14].
          super__Vector_base<const_char_*,_std::allocator<const_char_*>_>._M_impl.
          super__Vector_impl_data._M_finish) {
        local_1a8 = (undefined1  [8])local_198;
        std::__cxx11::string::_M_construct<char_const*>
                  ((string *)local_1a8," given COMMAND argument with no value.","");
        cmCommand::SetError(&this->super_cmCommand,(string *)local_1a8);
        goto LAB_002f0378;
      }
      this_00 = (vector<char_const*,std::allocator<char_const*>> *)
                (local_358.
                 super__Vector_base<std::vector<const_char_*,_std::allocator<const_char_*>_>,_std::allocator<std::vector<const_char_*,_std::allocator<const_char_*>_>_>_>
                 ._M_impl.super__Vector_impl_data._M_start + uVar14);
      local_1a8 = (undefined1  [8])0x0;
      __position._M_current = *(char ***)(this_00 + 8);
      if (__position._M_current == *(char ***)(this_00 + 0x10)) {
        std::vector<char_const*,std::allocator<char_const*>>::_M_realloc_insert<char_const*>
                  (this_00,__position,(char **)local_1a8);
      }
      else {
        *__position._M_current = (char *)0x0;
        *(long *)(this_00 + 8) = *(long *)(this_00 + 8) + 8;
      }
      uVar14 = ((long)local_358.
                      super__Vector_base<std::vector<const_char_*,_std::allocator<const_char_*>_>,_std::allocator<std::vector<const_char_*,_std::allocator<const_char_*>_>_>_>
                      ._M_impl.super__Vector_impl_data._M_finish -
                (long)local_358.
                      super__Vector_base<std::vector<const_char_*,_std::allocator<const_char_*>_>,_std::allocator<std::vector<const_char_*,_std::allocator<const_char_*>_>_>_>
                      ._M_impl.super__Vector_impl_data._M_start >> 3) * -0x5555555555555555;
      unaff_RBP = (ulong)((int)uVar10 + 1);
      bVar1 = uVar10 <= uVar14;
      lVar13 = uVar14 - uVar10;
      uVar14 = uVar10;
      uVar10 = unaff_RBP;
    } while (bVar1 && lVar13 != 0);
  }
  local_230 = -1.0;
  if ((local_308 != 0) && (iVar2 = __isoc99_sscanf(local_310,"%lg",&local_230), iVar2 != 1)) {
    local_1a8 = (undefined1  [8])local_198;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)local_1a8," called with TIMEOUT value that could not be parsed.","");
    cmCommand::SetError(&this->super_cmCommand,(string *)local_1a8);
    goto LAB_002f0378;
  }
  cp = cmsysProcess_New();
  if (local_358.
      super__Vector_base<std::vector<const_char_*,_std::allocator<const_char_*>_>,_std::allocator<std::vector<const_char_*,_std::allocator<const_char_*>_>_>_>
      ._M_impl.super__Vector_impl_data._M_finish !=
      local_358.
      super__Vector_base<std::vector<const_char_*,_std::allocator<const_char_*>_>,_std::allocator<std::vector<const_char_*,_std::allocator<const_char_*>_>_>_>
      ._M_impl.super__Vector_impl_data._M_start) {
    uVar14 = 0;
    uVar10 = 1;
    do {
      cmsysProcess_AddCommand
                (cp,local_358.
                    super__Vector_base<std::vector<const_char_*,_std::allocator<const_char_*>_>,_std::allocator<std::vector<const_char_*,_std::allocator<const_char_*>_>_>_>
                    ._M_impl.super__Vector_impl_data._M_start[uVar14].
                    super__Vector_base<const_char_*,_std::allocator<const_char_*>_>._M_impl.
                    super__Vector_impl_data._M_start);
      uVar14 = ((long)local_358.
                      super__Vector_base<std::vector<const_char_*,_std::allocator<const_char_*>_>,_std::allocator<std::vector<const_char_*,_std::allocator<const_char_*>_>_>_>
                      ._M_impl.super__Vector_impl_data._M_finish -
                (long)local_358.
                      super__Vector_base<std::vector<const_char_*,_std::allocator<const_char_*>_>,_std::allocator<std::vector<const_char_*,_std::allocator<const_char_*>_>_>_>
                      ._M_impl.super__Vector_impl_data._M_start >> 3) * -0x5555555555555555;
      unaff_RBP = (ulong)((int)uVar10 + 1);
      bVar1 = uVar10 <= uVar14;
      lVar13 = uVar14 - uVar10;
      uVar14 = uVar10;
      uVar10 = unaff_RBP;
    } while (bVar1 && lVar13 != 0);
  }
  if (local_1e0 != 0) {
    cmsysProcess_SetWorkingDirectory(cp,local_1e8);
  }
  cmsysProcess_SetOption(cp,0,1);
  if (local_1c0 != 0) {
    cmsysProcess_SetPipeFile(cp,1,local_1c8);
  }
  if (local_2b8._M_string_length != 0) {
    cmsysProcess_SetPipeFile(cp,2,local_2b8._M_dataplus._M_p);
  }
  if (local_200 == 0) {
LAB_002f00c8:
    uVar3 = 0;
  }
  else {
    if ((local_200 != local_2b8._M_string_length) ||
       (iVar2 = bcmp(local_208,local_2b8._M_dataplus._M_p,local_200), iVar2 != 0)) {
      cmsysProcess_SetPipeFile(cp,3,local_208);
      goto LAB_002f00c8;
    }
    uVar3 = (uint)CONCAT71((int7)(unaff_RBP >> 8),1);
  }
  local_2bc = uVar3;
  if ((local_278._M_string_length != 0) &&
     (local_278._M_string_length == local_298._M_string_length)) {
    iVar2 = bcmp(local_278._M_dataplus._M_p,local_298._M_dataplus._M_p,local_278._M_string_length);
    local_2bc = 1;
    if (iVar2 != 0) {
      local_2bc = uVar3 & 0xff;
    }
  }
  if ((char)local_2bc != '\0') {
    cmsysProcess_SetOption(cp,2,1);
  }
  if (0.0 <= local_230) {
    cmsysProcess_SetTimeout(cp,local_230);
  }
  cmsysProcess_Execute(cp);
  local_338._M_dataplus._M_p = (char *)0x0;
  local_338._M_string_length = 0;
  local_338.field_2._M_allocated_capacity = 0;
  local_258.field_2._M_allocated_capacity = 0;
  local_258._M_dataplus._M_p = (char *)0x0;
  local_258._M_string_length = 0;
LAB_002f0178:
  do {
    while (iVar2 = cmsysProcess_WaitForData(cp,&local_238,&local_33c,(double *)0x0), iVar2 == 2) {
      if (!bVar9) {
        pcVar6 = (char *)local_338._M_string_length;
        pbVar12 = &local_338;
        if (local_278._M_string_length == 0) {
          cmSystemTools::Stdout(local_238,(long)local_33c);
        }
        else {
LAB_002f0203:
          std::vector<char,std::allocator<char>>::_M_range_insert<char_const*>
                    ((vector<char,std::allocator<char>> *)pbVar12,pcVar6);
        }
      }
    }
    if (iVar2 == 3) {
      if ((local_318 & 1) == 0) {
        pcVar6 = (char *)local_258._M_string_length;
        pbVar12 = &local_258;
        if (local_298._M_string_length != 0) goto LAB_002f0203;
        cmSystemTools::Stderr(local_238,(long)local_33c);
      }
      goto LAB_002f0178;
    }
  } while (iVar2 != 0);
  cmsysProcess_WaitForExit(cp,(double *)0x0);
  cmExecuteProcessCommandFixText
            ((vector<char,_std::allocator<char>_> *)&local_338,(bool)((byte)local_2c8 & 1));
  cmExecuteProcessCommandFixText
            ((vector<char,_std::allocator<char>_> *)&local_258,(bool)((byte)local_2d0 & 1));
  if ((local_278._M_string_length != 0) &&
     (local_338._M_dataplus._M_p != (pointer)local_338._M_string_length)) {
    cmMakefile::AddDefinition
              ((this->super_cmCommand).Makefile,&local_278,local_338._M_dataplus._M_p);
  }
  if ((((char)local_2bc == '\0') && (local_298._M_string_length != 0)) &&
     (local_258._M_dataplus._M_p != (pointer)local_258._M_string_length)) {
    cmMakefile::AddDefinition
              ((this->super_cmCommand).Makefile,&local_298,local_258._M_dataplus._M_p);
  }
  if (local_228._M_string_length == 0) goto switchD_002f05c7_caseD_3;
  iVar2 = cmsysProcess_GetState(cp);
  switch(iVar2) {
  case 1:
    this_01 = (this->super_cmCommand).Makefile;
    pcVar6 = cmsysProcess_GetErrorString(cp);
    goto LAB_002f0821;
  case 2:
    this_01 = (this->super_cmCommand).Makefile;
    pcVar6 = cmsysProcess_GetExceptionString(cp);
LAB_002f0821:
    cmMakefile::AddDefinition(this_01,&local_228,pcVar6);
    break;
  case 4:
    uVar3 = cmsysProcess_GetExitValue(cp);
    sprintf(local_1a8,"%d",(ulong)uVar3);
    cmMakefile::AddDefinition((this->super_cmCommand).Makefile,&local_228,local_1a8);
    break;
  case 5:
    cmMakefile::AddDefinition
              ((this->super_cmCommand).Makefile,&local_228,"Process terminated due to timeout");
  }
switchD_002f05c7_caseD_3:
  cmsysProcess_Delete(cp);
  if (local_258._M_dataplus._M_p != (char *)0x0) {
    operator_delete(local_258._M_dataplus._M_p,
                    local_258.field_2._M_allocated_capacity - (long)local_258._M_dataplus._M_p);
  }
  if (local_338._M_dataplus._M_p != (char *)0x0) {
    operator_delete(local_338._M_dataplus._M_p,
                    local_338.field_2._M_allocated_capacity - (long)local_338._M_dataplus._M_p);
  }
  bVar9 = true;
LAB_002f0397:
  if (local_1e8 != &local_1d8) {
    operator_delete(local_1e8,CONCAT71(uStack_1d7,local_1d8) + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_228._M_dataplus._M_p != &local_228.field_2) {
    operator_delete(local_228._M_dataplus._M_p,
                    CONCAT71(local_228.field_2._M_allocated_capacity._1_7_,
                             local_228.field_2._M_local_buf[0]) + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_298._M_dataplus._M_p != &local_298.field_2) {
    operator_delete(local_298._M_dataplus._M_p,
                    CONCAT71(local_298.field_2._M_allocated_capacity._1_7_,
                             local_298.field_2._M_local_buf[0]) + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_278._M_dataplus._M_p != &local_278.field_2) {
    operator_delete(local_278._M_dataplus._M_p,
                    CONCAT71(local_278.field_2._M_allocated_capacity._1_7_,
                             local_278.field_2._M_local_buf[0]) + 1);
  }
  if (local_208 != &local_1f8) {
    operator_delete(local_208,CONCAT71(uStack_1f7,local_1f8) + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_2b8._M_dataplus._M_p != &local_2b8.field_2) {
    operator_delete(local_2b8._M_dataplus._M_p,
                    CONCAT71(local_2b8.field_2._M_allocated_capacity._1_7_,
                             local_2b8.field_2._M_local_buf[0]) + 1);
  }
  if (local_1c8 != &local_1b8) {
    operator_delete(local_1c8,CONCAT71(uStack_1b7,local_1b8) + 1);
  }
  if (local_310 != &local_300) {
    operator_delete(local_310,CONCAT71(uStack_2ff,local_300) + 1);
  }
  if (local_2f0 != &local_2e0) {
    operator_delete(local_2f0,CONCAT71(uStack_2df,local_2e0) + 1);
  }
  std::
  vector<std::vector<const_char_*,_std::allocator<const_char_*>_>,_std::allocator<std::vector<const_char_*,_std::allocator<const_char_*>_>_>_>
  ::~vector(&local_358);
  return bVar9;
}

Assistant:

bool cmExecuteProcessCommand
::InitialPass(std::vector<std::string> const& args, cmExecutionStatus &)
{
  if(args.size() < 1 )
    {
    this->SetError("called with incorrect number of arguments");
    return false;
    }
  std::vector< std::vector<const char*> > cmds;
  std::string arguments;
  bool doing_command = false;
  size_t command_index = 0;
  bool output_quiet = false;
  bool error_quiet = false;
  bool output_strip_trailing_whitespace = false;
  bool error_strip_trailing_whitespace = false;
  std::string timeout_string;
  std::string input_file;
  std::string output_file;
  std::string error_file;
  std::string output_variable;
  std::string error_variable;
  std::string result_variable;
  std::string working_directory;
  for(size_t i=0; i < args.size(); ++i)
    {
    if(args[i] == "COMMAND")
      {
      doing_command = true;
      command_index = cmds.size();
      cmds.push_back(std::vector<const char*>());
      }
    else if(args[i] == "OUTPUT_VARIABLE")
      {
      doing_command = false;
      if(++i < args.size())
        {
        output_variable = args[i];
        }
      else
        {
        this->SetError(" called with no value for OUTPUT_VARIABLE.");
        return false;
        }
      }
    else if(args[i] == "ERROR_VARIABLE")
      {
      doing_command = false;
      if(++i < args.size())
        {
        error_variable = args[i];
        }
      else
        {
        this->SetError(" called with no value for ERROR_VARIABLE.");
        return false;
        }
      }
    else if(args[i] == "RESULT_VARIABLE")
      {
      doing_command = false;
      if(++i < args.size())
        {
        result_variable = args[i];
        }
      else
        {
        this->SetError(" called with no value for RESULT_VARIABLE.");
        return false;
        }
      }
    else if(args[i] == "WORKING_DIRECTORY")
      {
      doing_command = false;
      if(++i < args.size())
        {
        working_directory = args[i];
        }
      else
        {
        this->SetError(" called with no value for WORKING_DIRECTORY.");
        return false;
        }
      }
    else if(args[i] == "INPUT_FILE")
      {
      doing_command = false;
      if(++i < args.size())
        {
        input_file = args[i];
        }
      else
        {
        this->SetError(" called with no value for INPUT_FILE.");
        return false;
        }
      }
    else if(args[i] == "OUTPUT_FILE")
      {
      doing_command = false;
      if(++i < args.size())
        {
        output_file = args[i];
        }
      else
        {
        this->SetError(" called with no value for OUTPUT_FILE.");
        return false;
        }
      }
    else if(args[i] == "ERROR_FILE")
      {
      doing_command = false;
      if(++i < args.size())
        {
        error_file = args[i];
        }
      else
        {
        this->SetError(" called with no value for ERROR_FILE.");
        return false;
        }
      }
    else if(args[i] == "TIMEOUT")
      {
      doing_command = false;
      if(++i < args.size())
        {
        timeout_string = args[i];
        }
      else
        {
        this->SetError(" called with no value for TIMEOUT.");
        return false;
        }
      }
    else if(args[i] == "OUTPUT_QUIET")
      {
      doing_command = false;
      output_quiet = true;
      }
    else if(args[i] == "ERROR_QUIET")
      {
      doing_command = false;
      error_quiet = true;
      }
    else if(args[i] == "OUTPUT_STRIP_TRAILING_WHITESPACE")
      {
      doing_command = false;
      output_strip_trailing_whitespace = true;
      }
    else if(args[i] == "ERROR_STRIP_TRAILING_WHITESPACE")
      {
      doing_command = false;
      error_strip_trailing_whitespace = true;
      }
    else if(doing_command)
      {
      cmds[command_index].push_back(args[i].c_str());
      }
    else
      {
      std::ostringstream e;
      e << " given unknown argument \"" << args[i] << "\".";
      this->SetError(e.str());
      return false;
      }
    }

  if ( !this->Makefile->CanIWriteThisFile(output_file.c_str()) )
    {
    std::string e = "attempted to output into a file: " + output_file
      + " into a source directory.";
    this->SetError(e);
    cmSystemTools::SetFatalErrorOccured();
    return false;
    }

  // Check for commands given.
  if(cmds.empty())
    {
    this->SetError(" called with no COMMAND argument.");
    return false;
    }
  for(unsigned int i=0; i < cmds.size(); ++i)
    {
    if(cmds[i].empty())
      {
      this->SetError(" given COMMAND argument with no value.");
      return false;
      }
    else
      {
      // Add the null terminating pointer to the command argument list.
      cmds[i].push_back(0);
      }
    }

  // Parse the timeout string.
  double timeout = -1;
  if(!timeout_string.empty())
    {
    if(sscanf(timeout_string.c_str(), "%lg", &timeout) != 1)
      {
      this->SetError(" called with TIMEOUT value that could not be parsed.");
      return false;
      }
    }

  // Create a process instance.
  cmsysProcess* cp = cmsysProcess_New();

  // Set the command sequence.
  for(unsigned int i=0; i < cmds.size(); ++i)
    {
    cmsysProcess_AddCommand(cp, &*cmds[i].begin());
    }

  // Set the process working directory.
  if(!working_directory.empty())
    {
    cmsysProcess_SetWorkingDirectory(cp, working_directory.c_str());
    }

  // Always hide the process window.
  cmsysProcess_SetOption(cp, cmsysProcess_Option_HideWindow, 1);

  // Check the output variables.
  bool merge_output = false;
  if(!input_file.empty())
    {
    cmsysProcess_SetPipeFile(cp, cmsysProcess_Pipe_STDIN, input_file.c_str());
    }
  if(!output_file.empty())
    {
    cmsysProcess_SetPipeFile(cp, cmsysProcess_Pipe_STDOUT,
                             output_file.c_str());
    }
  if(!error_file.empty())
    {
    if (error_file == output_file)
      {
      merge_output = true;
      }
    else
      {
      cmsysProcess_SetPipeFile(cp, cmsysProcess_Pipe_STDERR,
                               error_file.c_str());
      }
    }
  if (!output_variable.empty() && output_variable == error_variable)
    {
    merge_output = true;
    }
  if (merge_output)
    {
    cmsysProcess_SetOption(cp, cmsysProcess_Option_MergeOutput, 1);
    }

  // Set the timeout if any.
  if(timeout >= 0)
    {
    cmsysProcess_SetTimeout(cp, timeout);
    }

  // Start the process.
  cmsysProcess_Execute(cp);

  // Read the process output.
  std::vector<char> tempOutput;
  std::vector<char> tempError;
  int length;
  char* data;
  int p;
  while((p = cmsysProcess_WaitForData(cp, &data, &length, 0), p))
    {
    // Put the output in the right place.
    if (p == cmsysProcess_Pipe_STDOUT && !output_quiet)
      {
      if(output_variable.empty())
        {
        cmSystemTools::Stdout(data, length);
        }
      else
        {
        cmExecuteProcessCommandAppend(tempOutput, data, length);
        }
      }
    else if(p == cmsysProcess_Pipe_STDERR && !error_quiet)
      {
      if(error_variable.empty())
        {
        cmSystemTools::Stderr(data, length);
        }
      else
        {
        cmExecuteProcessCommandAppend(tempError, data, length);
        }
      }
    }

  // All output has been read.  Wait for the process to exit.
  cmsysProcess_WaitForExit(cp, 0);

  // Fix the text in the output strings.
  cmExecuteProcessCommandFixText(tempOutput,
                                 output_strip_trailing_whitespace);
  cmExecuteProcessCommandFixText(tempError,
                                 error_strip_trailing_whitespace);

  // Store the output obtained.
  if(!output_variable.empty() && !tempOutput.empty())
    {
    this->Makefile->AddDefinition(output_variable,
                                  &*tempOutput.begin());
    }
  if(!merge_output && !error_variable.empty() && !tempError.empty())
    {
    this->Makefile->AddDefinition(error_variable,
                                  &*tempError.begin());
    }

  // Store the result of running the process.
  if(!result_variable.empty())
    {
    switch(cmsysProcess_GetState(cp))
      {
      case cmsysProcess_State_Exited:
        {
        int v = cmsysProcess_GetExitValue(cp);
        char buf[100];
        sprintf(buf, "%d", v);
        this->Makefile->AddDefinition(result_variable, buf);
        }
        break;
      case cmsysProcess_State_Exception:
        this->Makefile->AddDefinition(result_variable,
                                  cmsysProcess_GetExceptionString(cp));
        break;
      case cmsysProcess_State_Error:
        this->Makefile->AddDefinition(result_variable,
                                  cmsysProcess_GetErrorString(cp));
        break;
      case cmsysProcess_State_Expired:
        this->Makefile->AddDefinition(result_variable,
                                  "Process terminated due to timeout");
        break;
      }
    }

  // Delete the process instance.
  cmsysProcess_Delete(cp);

  return true;
}